

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectGlow.cpp
# Opt level: O3

bool __thiscall
Rml::FontEffectGlow::Initialise
          (FontEffectGlow *this,int _width_outline,int _width_blur,Vector2i _offset)

{
  ConvolutionFilter *this_00;
  ConvolutionFilter *this_01;
  bool bVar1;
  float *pfVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  Vector2i _kernel_radii;
  long lVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  if (-1 < (_width_blur | _width_outline)) {
    this->width_outline = _width_outline;
    this->width_blur = _width_blur;
    this->combined_width = _width_blur + _width_outline;
    this->offset = _offset;
    ConvolutionFilter::Initialise(&this->filter_outline,_width_outline,Dilation);
    uVar3 = this->width_outline;
    uVar6 = (ulong)uVar3;
    if (-1 < (int)uVar3) {
      iVar9 = -uVar3;
      do {
        uVar3 = (uint)uVar6;
        if (-1 < (int)uVar3) {
          uVar4 = ~uVar3;
          lVar8 = (long)(int)-uVar3;
          do {
            fVar10 = Math::SquareRoot((float)((int)lVar8 * (int)lVar8 + iVar9 * iVar9));
            iVar5 = this->width_outline;
            fVar13 = 1.0;
            if (((float)iVar5 < fVar10) && (fVar13 = (float)(iVar5 + 1) - fVar10, fVar13 <= 0.0)) {
              fVar13 = 0.0;
            }
            pfVar2 = ConvolutionFilter::operator[](&this->filter_outline,iVar5 + iVar9);
            iVar5 = this->width_outline;
            uVar6 = (ulong)iVar5;
            pfVar2[uVar6 + lVar8] = fVar13;
            uVar4 = uVar4 + 1;
            lVar8 = lVar8 + 1;
          } while ((int)uVar4 < iVar5);
        }
        bVar1 = iVar9 < (int)uVar6;
        iVar9 = iVar9 + 1;
      } while (bVar1);
    }
    fVar10 = 1.0;
    if (this->width_blur != 0) {
      fVar10 = (float)this->width_blur * 0.4;
    }
    fVar10 = (fVar10 + fVar10) * fVar10;
    fVar13 = Math::SquareRoot(fVar10 * 3.1415927);
    this_00 = &this->filter_blur_x;
    _kernel_radii.y = 0;
    _kernel_radii.x = this->width_blur;
    ConvolutionFilter::Initialise(this_00,_kernel_radii,Sum);
    this_01 = &this->filter_blur_y;
    ConvolutionFilter::Initialise(this_01,(Vector2i)((ulong)(uint)this->width_blur << 0x20),Sum);
    iVar9 = this->width_blur;
    iVar5 = -iVar9;
    if (iVar9 < 0) {
      fVar11 = 0.0;
    }
    else {
      lVar8 = (long)iVar5;
      fVar11 = 0.0;
      do {
        iVar5 = (int)lVar8;
        fVar12 = Math::SquareRoot((float)(iVar5 * iVar5) / fVar10);
        fVar12 = Math::Exp(-fVar12);
        fVar12 = fVar12 * (1.0 / fVar13);
        pfVar2 = ConvolutionFilter::operator[](this_00,0);
        iVar9 = this->width_blur;
        pfVar2[iVar9 + lVar8] = fVar12;
        pfVar2 = ConvolutionFilter::operator[](this_01,iVar9 + iVar5);
        *pfVar2 = fVar12;
        fVar11 = fVar11 + fVar12;
        lVar8 = lVar8 + 1;
        iVar9 = this->width_blur;
      } while (iVar5 < iVar9);
      iVar5 = -iVar9;
    }
    if (iVar5 <= iVar9) {
      lVar8 = (long)iVar5;
      do {
        pfVar2 = ConvolutionFilter::operator[](this_00,0);
        iVar9 = this->width_blur;
        iVar5 = (int)lVar8;
        lVar7 = iVar9 + lVar8;
        pfVar2[lVar7] = pfVar2[lVar7] / fVar11;
        pfVar2 = ConvolutionFilter::operator[](this_01,iVar9 + iVar5);
        *pfVar2 = *pfVar2 / fVar11;
        lVar8 = lVar8 + 1;
      } while (iVar5 < this->width_blur);
    }
  }
  return -1 < (_width_blur | _width_outline);
}

Assistant:

bool FontEffectGlow::Initialise(int _width_outline, int _width_blur, Vector2i _offset)
{
	if (_width_outline < 0 || _width_blur < 0)
		return false;

	width_outline = _width_outline;
	width_blur = _width_blur;
	combined_width = width_blur + width_outline;
	offset = _offset;

	// Outline filter.
	filter_outline.Initialise(width_outline, FilterOperation::Dilation);
	for (int x = -width_outline; x <= width_outline; ++x)
	{
		for (int y = -width_outline; y <= width_outline; ++y)
		{
			float weight = 1;

			float distance = Math::SquareRoot(float(x * x + y * y));
			if (distance > width_outline)
			{
				weight = (width_outline + 1) - distance;
				weight = Math::Max(weight, 0.0f);
			}

			filter_outline[x + width_outline][y + width_outline] = weight;
		}
	}

	// Gaussian blur filter
	const float std_dev = (width_blur == 0 ? 1.f : .4f * float(width_blur));
	const float two_variance = 2.f * std_dev * std_dev;
	const float gain = 1.f / Math::SquareRoot(Math::RMLUI_PI * two_variance);

	float sum_weight = 0.f;

	// We separate the blur filter into two passes, horizontal and vertical, for performance reasons.
	filter_blur_x.Initialise(Vector2i(width_blur, 0), FilterOperation::Sum);
	filter_blur_y.Initialise(Vector2i(0, width_blur), FilterOperation::Sum);

	for (int x = -width_blur; x <= width_blur; ++x)
	{
		float weight = gain * Math::Exp(-Math::SquareRoot(float(x * x) / two_variance));

		filter_blur_x[0][x + width_blur] = weight;
		filter_blur_y[x + width_blur][0] = weight;
		sum_weight += weight;
	}

	// Normalize the kernels
	for (int x = -width_blur; x <= width_blur; ++x)
	{
		filter_blur_x[0][x + width_blur] /= sum_weight;
		filter_blur_y[x + width_blur][0] /= sum_weight;
	}

	return true;
}